

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<char32_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_char32_t_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<char32_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_char32_t_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           *this,_func_char32_t_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                 *f)

{
  _func_char32_t_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *in_RDX;
  _Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_30;
  
  detail::build_param_type_list<char32_t,std::__cxx11::string_const&>
            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_30,
             (detail *)0x0,in_RDX);
  Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            (&this->super_Proxy_Function_Impl_Base,
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_30);
  std::_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~_Vector_base
            (&local_30);
  (this->super_Proxy_Function_Impl_Base).super_Proxy_Function_Base._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Proxy_Function_Base_00476950;
  this->m_f = f;
  return;
}

Assistant:

explicit Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr)))
          , m_f(std::move(f)) {
      }